

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ExceptionOr<kj::HttpClient::WebSocketResponse>::ExceptionOr
          (ExceptionOr<kj::HttpClient::WebSocketResponse> *this,WebSocketResponse *value)

{
  char *pcVar1;
  size_t sVar2;
  HttpHeaders *pHVar3;
  
  (this->super_ExceptionOrValue).exception.ptr.isSet = false;
  (this->value).ptr.isSet = true;
  pcVar1 = (value->statusText).content.ptr;
  sVar2 = (value->statusText).content.size_;
  pHVar3 = value->headers;
  *(undefined8 *)&(this->value).ptr.field_1 = *(undefined8 *)value;
  (this->value).ptr.field_1.value.statusText.content.ptr = pcVar1;
  (this->value).ptr.field_1.value.statusText.content.size_ = sVar2;
  (this->value).ptr.field_1.value.headers = pHVar3;
  OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>::
  moveFrom(&(this->value).ptr.field_1.value.webSocketOrBody,&value->webSocketOrBody);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}